

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::DescriptorProto::_InternalParse(DescriptorProto *this,char *ptr,ParseContext *ctx)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte bVar2;
  int iVar3;
  DescriptorProto_ExtensionRange *msg;
  string *psVar4;
  DescriptorProto *msg_00;
  EnumDescriptorProto *msg_01;
  OneofDescriptorProto *msg_02;
  FieldDescriptorProto *pFVar5;
  MessageOptions *msg_03;
  Rep *pRVar6;
  DescriptorProto_ReservedRange *msg_04;
  char cVar7;
  uint32 res;
  uint tag;
  int iVar8;
  Arena *pAVar9;
  char *ptr_00;
  pair<const_char_*,_unsigned_int> pVar10;
  pair<const_char_*,_bool> pVar11;
  
  this_00 = &this->name_;
LAB_00171290:
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        return (char *)(byte *)ptr;
      }
      pVar11 = internal::EpsCopyInputStream::DoneFallback
                         (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar11.first;
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return (char *)(byte *)ptr;
      }
    }
    bVar1 = *ptr;
    pVar10.second._0_1_ = bVar1;
    pVar10.first = (char *)((byte *)ptr + 1);
    pVar10._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar10 = internal::ReadTagFallback(ptr,res);
        if (pVar10.first == (char *)0x0) {
          return (char *)0x0;
        }
      }
      else {
        pVar10.second = res;
        pVar10.first = (char *)((byte *)ptr + 2);
        pVar10._12_4_ = 0;
      }
    }
    ptr_00 = pVar10.first;
    tag = pVar10.second;
    cVar7 = (char)pVar10.second;
    switch((uint)(pVar10._8_8_ >> 3) & 0x1fffffff) {
    case 1:
      if (cVar7 != '\n') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      pAVar9 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar9 & 1) != 0) {
        pAVar9 = *(Arena **)(((ulong)pAVar9 & 0xfffffffffffffffe) + 0x18);
      }
      psVar4 = this_00->ptr_;
      if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (this_00,pAVar9,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar4 = this_00->ptr_;
      }
      ptr = internal::InlineGreedyStringParser(psVar4,ptr_00,ctx);
      goto LAB_001719b0;
    case 2:
      if (cVar7 == '\x12') {
        ptr = ptr_00 + -1;
        do {
          pRVar6 = (this->field_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar6 == (Rep *)0x0) {
            iVar8 = (this->field_).super_RepeatedPtrFieldBase.total_size_;
LAB_0017172a:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->field_).super_RepeatedPtrFieldBase,iVar8 + 1);
            pRVar6 = (this->field_).super_RepeatedPtrFieldBase.rep_;
            iVar8 = pRVar6->allocated_size;
LAB_0017173c:
            pRVar6->allocated_size = iVar8 + 1;
            pFVar5 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>
                               ((this->field_).super_RepeatedPtrFieldBase.arena_);
            pRVar6 = (this->field_).super_RepeatedPtrFieldBase.rep_;
            iVar8 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
            (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar8 + 1;
            pRVar6->elements[iVar8] = pFVar5;
          }
          else {
            iVar3 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
            iVar8 = pRVar6->allocated_size;
            if (iVar8 <= iVar3) {
              if (iVar8 == (this->field_).super_RepeatedPtrFieldBase.total_size_) goto LAB_0017172a;
              goto LAB_0017173c;
            }
            (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            pFVar5 = (FieldDescriptorProto *)pRVar6->elements[iVar3];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::FieldDescriptorProto>
                          (ctx,pFVar5,(char *)((byte *)ptr + 1));
          if ((byte *)ptr == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x12));
        goto LAB_00171290;
      }
      break;
    case 3:
      if (cVar7 == '\x1a') {
        ptr = ptr_00 + -1;
        do {
          pRVar6 = (this->nested_type_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar6 == (Rep *)0x0) {
            iVar8 = (this->nested_type_).super_RepeatedPtrFieldBase.total_size_;
LAB_00171511:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->nested_type_).super_RepeatedPtrFieldBase,iVar8 + 1);
            pRVar6 = (this->nested_type_).super_RepeatedPtrFieldBase.rep_;
            iVar8 = pRVar6->allocated_size;
LAB_00171523:
            pRVar6->allocated_size = iVar8 + 1;
            msg_00 = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto>
                               ((this->nested_type_).super_RepeatedPtrFieldBase.arena_);
            pRVar6 = (this->nested_type_).super_RepeatedPtrFieldBase.rep_;
            iVar8 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
            (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar8 + 1;
            pRVar6->elements[iVar8] = msg_00;
          }
          else {
            iVar3 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
            iVar8 = pRVar6->allocated_size;
            if (iVar8 <= iVar3) {
              if (iVar8 == (this->nested_type_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_00171511;
              goto LAB_00171523;
            }
            (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg_00 = (DescriptorProto *)pRVar6->elements[iVar3];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::DescriptorProto>
                          (ctx,msg_00,(char *)((byte *)ptr + 1));
          if ((byte *)ptr == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x1a));
        goto LAB_00171290;
      }
      break;
    case 4:
      if (cVar7 == '\"') {
        ptr = ptr_00 + -1;
        do {
          pRVar6 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar6 == (Rep *)0x0) {
            iVar8 = (this->enum_type_).super_RepeatedPtrFieldBase.total_size_;
LAB_001715b9:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar8 + 1);
            pRVar6 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
            iVar8 = pRVar6->allocated_size;
LAB_001715cb:
            pRVar6->allocated_size = iVar8 + 1;
            msg_01 = Arena::CreateMaybeMessage<google::protobuf::EnumDescriptorProto>
                               ((this->enum_type_).super_RepeatedPtrFieldBase.arena_);
            pRVar6 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
            iVar8 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
            (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar8 + 1;
            pRVar6->elements[iVar8] = msg_01;
          }
          else {
            iVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
            iVar8 = pRVar6->allocated_size;
            if (iVar8 <= iVar3) {
              if (iVar8 == (this->enum_type_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_001715b9;
              goto LAB_001715cb;
            }
            (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg_01 = (EnumDescriptorProto *)pRVar6->elements[iVar3];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::EnumDescriptorProto>
                          (ctx,msg_01,(char *)((byte *)ptr + 1));
          if ((byte *)ptr == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x22));
        goto LAB_00171290;
      }
      break;
    case 5:
      if (cVar7 == '*') {
        ptr = ptr_00 + -1;
        do {
          pRVar6 = (this->extension_range_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar6 == (Rep *)0x0) {
            iVar8 = (this->extension_range_).super_RepeatedPtrFieldBase.total_size_;
LAB_0017135f:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->extension_range_).super_RepeatedPtrFieldBase,iVar8 + 1);
            pRVar6 = (this->extension_range_).super_RepeatedPtrFieldBase.rep_;
            iVar8 = pRVar6->allocated_size;
LAB_00171371:
            pRVar6->allocated_size = iVar8 + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ExtensionRange>
                            ((this->extension_range_).super_RepeatedPtrFieldBase.arena_);
            pRVar6 = (this->extension_range_).super_RepeatedPtrFieldBase.rep_;
            iVar8 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
            (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar8 + 1;
            pRVar6->elements[iVar8] = msg;
          }
          else {
            iVar3 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
            iVar8 = pRVar6->allocated_size;
            if (iVar8 <= iVar3) {
              if (iVar8 == (this->extension_range_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_0017135f;
              goto LAB_00171371;
            }
            (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg = (DescriptorProto_ExtensionRange *)pRVar6->elements[iVar3];
          }
          ptr = internal::ParseContext::
                ParseMessage<google::protobuf::DescriptorProto_ExtensionRange>
                          (ctx,msg,(char *)((byte *)ptr + 1));
          if ((byte *)ptr == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x2a));
        goto LAB_00171290;
      }
      break;
    case 6:
      if (cVar7 == '2') {
        ptr = ptr_00 + -1;
        do {
          pRVar6 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar6 == (Rep *)0x0) {
            iVar8 = (this->extension_).super_RepeatedPtrFieldBase.total_size_;
LAB_001717d8:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->extension_).super_RepeatedPtrFieldBase,iVar8 + 1);
            pRVar6 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
            iVar8 = pRVar6->allocated_size;
LAB_001717ed:
            pRVar6->allocated_size = iVar8 + 1;
            pFVar5 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>
                               ((this->extension_).super_RepeatedPtrFieldBase.arena_);
            pRVar6 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
            iVar8 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
            (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar8 + 1;
            pRVar6->elements[iVar8] = pFVar5;
          }
          else {
            iVar3 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
            iVar8 = pRVar6->allocated_size;
            if (iVar8 <= iVar3) {
              if (iVar8 == (this->extension_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_001717d8;
              goto LAB_001717ed;
            }
            (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            pFVar5 = (FieldDescriptorProto *)pRVar6->elements[iVar3];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::FieldDescriptorProto>
                          (ctx,pFVar5,(char *)((byte *)ptr + 1));
          if ((byte *)ptr == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x32));
        goto LAB_00171290;
      }
      break;
    case 7:
      if (cVar7 == ':') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        msg_03 = this->options_;
        if (msg_03 == (MessageOptions *)0x0) {
          pAVar9 = (Arena *)(this->_internal_metadata_).
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            .ptr_;
          if (((ulong)pAVar9 & 1) != 0) {
            pAVar9 = *(Arena **)(((ulong)pAVar9 & 0xfffffffffffffffe) + 0x18);
          }
          msg_03 = Arena::CreateMaybeMessage<google::protobuf::MessageOptions>(pAVar9);
          this->options_ = msg_03;
        }
        ptr = internal::ParseContext::ParseMessage<google::protobuf::MessageOptions>
                        (ctx,msg_03,ptr_00);
        goto LAB_001719b0;
      }
      break;
    case 8:
      if (cVar7 == 'B') {
        ptr = ptr_00 + -1;
        do {
          pRVar6 = (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar6 == (Rep *)0x0) {
            iVar8 = (this->oneof_decl_).super_RepeatedPtrFieldBase.total_size_;
LAB_00171667:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->oneof_decl_).super_RepeatedPtrFieldBase,iVar8 + 1);
            pRVar6 = (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
            iVar8 = pRVar6->allocated_size;
LAB_0017167c:
            pRVar6->allocated_size = iVar8 + 1;
            msg_02 = Arena::CreateMaybeMessage<google::protobuf::OneofDescriptorProto>
                               ((this->oneof_decl_).super_RepeatedPtrFieldBase.arena_);
            pRVar6 = (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
            iVar8 = (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
            (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ = iVar8 + 1;
            pRVar6->elements[iVar8] = msg_02;
          }
          else {
            iVar3 = (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
            iVar8 = pRVar6->allocated_size;
            if (iVar8 <= iVar3) {
              if (iVar8 == (this->oneof_decl_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_00171667;
              goto LAB_0017167c;
            }
            (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg_02 = (OneofDescriptorProto *)pRVar6->elements[iVar3];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::OneofDescriptorProto>
                          (ctx,msg_02,(char *)((byte *)ptr + 1));
          if ((byte *)ptr == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x42));
        goto LAB_00171290;
      }
      break;
    case 9:
      if (cVar7 == 'J') {
        ptr = ptr_00 + -1;
        do {
          pRVar6 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar6 == (Rep *)0x0) {
            iVar8 = (this->reserved_range_).super_RepeatedPtrFieldBase.total_size_;
LAB_001718e9:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->reserved_range_).super_RepeatedPtrFieldBase,iVar8 + 1);
            pRVar6 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
            iVar8 = pRVar6->allocated_size;
LAB_001718fe:
            pRVar6->allocated_size = iVar8 + 1;
            msg_04 = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ReservedRange>
                               ((this->reserved_range_).super_RepeatedPtrFieldBase.arena_);
            pRVar6 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
            iVar8 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
            (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar8 + 1;
            pRVar6->elements[iVar8] = msg_04;
          }
          else {
            iVar3 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
            iVar8 = pRVar6->allocated_size;
            if (iVar8 <= iVar3) {
              if (iVar8 == (this->reserved_range_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_001718e9;
              goto LAB_001718fe;
            }
            (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg_04 = (DescriptorProto_ReservedRange *)pRVar6->elements[iVar3];
          }
          ptr = internal::ParseContext::
                ParseMessage<google::protobuf::DescriptorProto_ReservedRange>
                          (ctx,msg_04,(char *)((byte *)ptr + 1));
          if ((byte *)ptr == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x4a));
        goto LAB_00171290;
      }
      break;
    case 10:
      if (cVar7 == 'R') {
        ptr = ptr_00 + -1;
        do {
          pRVar6 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar6 == (Rep *)0x0) {
            iVar8 = (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_;
LAB_00171439:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->reserved_name_).super_RepeatedPtrFieldBase,iVar8 + 1);
            pRVar6 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
            iVar8 = pRVar6->allocated_size;
LAB_0017144c:
            pRVar6->allocated_size = iVar8 + 1;
            pAVar9 = (this->reserved_name_).super_RepeatedPtrFieldBase.arena_;
            if (pAVar9 == (Arena *)0x0) {
              psVar4 = (string *)operator_new(0x20);
            }
            else {
              if (pAVar9->hooks_cookie_ != (void *)0x0) {
                Arena::OnArenaAllocation(pAVar9,(type_info *)&std::__cxx11::string::typeinfo,0x20);
              }
              psVar4 = (string *)
                       internal::ArenaImpl::AllocateAlignedAndAddCleanup
                                 (&pAVar9->impl_,0x20,
                                  internal::arena_destruct_object<std::__cxx11::string>);
            }
            (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
            psVar4->_M_string_length = 0;
            (psVar4->field_2)._M_local_buf[0] = '\0';
            pRVar6 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
            iVar8 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
            (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar8 + 1;
            pRVar6->elements[iVar8] = psVar4;
          }
          else {
            iVar3 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
            iVar8 = pRVar6->allocated_size;
            if (iVar8 <= iVar3) {
              if (iVar8 == (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_00171439;
              goto LAB_0017144c;
            }
            (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            psVar4 = (string *)pRVar6->elements[iVar3];
          }
          ptr = internal::InlineGreedyStringParser(psVar4,(char *)((byte *)ptr + 1),ctx);
          if ((byte *)ptr == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x52));
        goto LAB_00171290;
      }
    }
    if ((tag == 0) || ((tag & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
      return ptr_00;
    }
    ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr_00,ctx);
LAB_001719b0:
    if ((byte *)ptr == (byte *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* DescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.DescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FieldDescriptorProto field = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_field(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto nested_type = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_nested_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_enum_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_extension_range(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<42>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FieldDescriptorProto extension = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_extension(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<50>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.MessageOptions options = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_oneof_decl(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<66>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_reserved_range(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<74>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string reserved_name = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_reserved_name(), ptr, ctx, "google.protobuf.DescriptorProto.reserved_name");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<82>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}